

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::labelled_statement,std::__cxx11::wstring_const&,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
          (parser *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args,
          unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_1)

{
  position_stack_node *this_00;
  labelled_statement *this_01;
  statement_ptr *in_RCX;
  source_extend sStack_48;
  
  this_00 = (position_stack_node *)args[3].field_2._M_allocated_capacity;
  if (this_00 != (position_stack_node *)0x0) {
    this_01 = (labelled_statement *)operator_new(0x48);
    position_stack_node::extend(&sStack_48,this_00);
    labelled_statement::labelled_statement(this_01,&sStack_48,(wstring *)args_1,in_RCX);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
  }
  __assert_fail("statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x147,
                "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::labelled_statement, Args = <const std::basic_string<wchar_t> &, std::unique_ptr<mjs::statement>>]"
               );
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }